

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.cpp
# Opt level: O3

string * __thiscall Worker::process(string *__return_storage_ptr__,Worker *this,string *request)

{
  char *__s;
  bool bVar1;
  string *psVar2;
  size_t sVar3;
  Ch *__s_00;
  Error error;
  allocator<char> local_a9;
  Error local_a8;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_88;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_58;
  
  parse_and_validate_json_request(&local_a8,this,request);
  bVar1 = Error::operator_cast_to_bool(&local_a8);
  if (bVar1) {
    local_58.os_ = &local_88;
    local_88.stack_.stack_ = (char *)0x0;
    local_88.stack_.stackTop_ = (char *)0x0;
    local_88.stack_.allocator_ = (CrtAllocator *)0x0;
    local_88.stack_.ownAllocator_ = (CrtAllocator *)0x0;
    local_88.stack_.stackEnd_ = (char *)0x0;
    local_88.stack_.initialCapacity_ = 0x100;
    local_58.level_stack_.allocator_ = (CrtAllocator *)0x0;
    local_58.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
    local_58.level_stack_.stack_ = (char *)0x0;
    local_58.level_stack_.stackTop_ = (char *)0x0;
    local_58.level_stack_.stackEnd_ = (char *)0x0;
    local_58.level_stack_.initialCapacity_ = 0x200;
    local_58.maxDecimalPlaces_ = 0x144;
    local_58.hasRoot_ = false;
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartObject(&local_58);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String(&local_58,"error",5,false);
    psVar2 = Error::get_abi_cxx11_(&local_a8);
    __s = (psVar2->_M_dataplus)._M_p;
    sVar3 = strlen(__s);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String(&local_58,__s,(SizeType)sVar3,false);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndObject(&local_58,0);
    __s_00 = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
             GetString(&local_88);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s_00,&local_a9);
    free(local_58.level_stack_.stack_);
    operator_delete(local_58.level_stack_.ownAllocator_,1);
    free(local_88.stack_.stack_);
    operator_delete(local_88.stack_.ownAllocator_,1);
  }
  else {
    prepare_containers(this);
    SharedBarrier::reset
              (&this->run_start_barrier_,
               (uint)((ulong)((long)(this->containers_).
                                    super__Vector_base<Container_*,_std::allocator<Container_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->containers_).
                                   super__Vector_base<Container_*,_std::allocator<Container_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2) | 1);
    write_tasks(this);
    run_tasks(this);
    close_pipes(this);
    collect_results_abi_cxx11_(__return_storage_ptr__,this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.error_._M_dataplus._M_p != &local_a8.error_.field_2) {
    operator_delete(local_a8.error_._M_dataplus._M_p,
                    local_a8.error_.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Worker::process(const std::string &request) {
    auto error = parse_and_validate_json_request(request);
    if (error) {
        rapidjson::StringBuffer string_buffer;
        rapidjson::Writer<rapidjson::StringBuffer> writer(string_buffer);
        writer.StartObject();
        writer.Key("error");
        writer.String(error.get().c_str());
        writer.EndObject();
        return string_buffer.GetString();
    }

    prepare_containers();
    // To start execution we must wait for worker + all containers + all slaves
    run_start_barrier_.reset(containers_.size() * 2 + 1);
    write_tasks();
    run_tasks();
    close_pipes();

    return collect_results();
}